

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

char * funcnamefromcall(lua_State *L,CallInfo *ci,char **name)

{
  ushort uVar1;
  uint uVar2;
  Proto *p;
  Instruction *pIVar3;
  char *pcVar4;
  int iVar5;
  
  uVar1 = ci->callstatus;
  if ((uVar1 & 8) != 0) {
    *name = "?";
    return "hook";
  }
  if ((char)uVar1 < '\0') {
    pcVar4 = "__gc";
  }
  else {
    if ((uVar1 & 2) != 0) {
      return (char *)0x0;
    }
    p = *(Proto **)((((ci->func).p)->val).value_.f + 0x18);
    pIVar3 = p->code;
    iVar5 = (int)((ulong)((long)(ci->u).l.savedpc - (long)pIVar3) >> 2);
    uVar2 = pIVar3[(long)iVar5 + -1];
    pcVar4 = (char *)0x0;
    switch(uVar2 & 0x7f) {
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0x14:
      break;
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
      pcVar4 = (char *)0x1;
      break;
    default:
      goto switchD_0013f849_caseD_13;
    case 0x2e:
    case 0x2f:
    case 0x30:
      pcVar4 = (char *)(ulong)(uVar2 >> 0x18);
      break;
    case 0x31:
      pcVar4 = (char *)0x12;
      break;
    case 0x32:
      pcVar4 = (char *)0x13;
      break;
    case 0x34:
      pcVar4 = (char *)0x4;
      break;
    case 0x35:
      pcVar4 = (char *)0x16;
      break;
    case 0x36:
    case 0x46:
      pcVar4 = (char *)0x18;
      break;
    case 0x39:
      pcVar4 = (char *)0x5;
      break;
    case 0x3a:
    case 0x3e:
    case 0x40:
      pcVar4 = (char *)0x14;
      break;
    case 0x3b:
    case 0x3f:
    case 0x41:
      pcVar4 = (char *)0x15;
      break;
    case 0x44:
    case 0x45:
      pcVar4 = getobjname(p,iVar5 + -1,uVar2 >> 7 & 0xff,name);
      return pcVar4;
    case 0x4c:
      *name = "for iterator";
      return "for iterator";
    }
    pcVar4 = &L->l_G->tmname[(long)pcVar4]->field_0x1a;
  }
  *name = pcVar4;
  pcVar4 = "metamethod";
switchD_0013f849_caseD_13:
  return pcVar4;
}

Assistant:

static const char *funcnamefromcall (lua_State *L, CallInfo *ci,
                                                   const char **name) {
  if (ci->callstatus & CIST_HOOKED) {  /* was it called inside a hook? */
    *name = "?";
    return "hook";
  }
  else if (ci->callstatus & CIST_FIN) {  /* was it called as a finalizer? */
    *name = "__gc";
    return "metamethod";  /* report it as such */
  }
  else if (isLua(ci))
    return funcnamefromcode(L, ci_func(ci)->p, currentpc(ci), name);
  else
    return NULL;
}